

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptType(HlslGrammar *this,TType *type,TIntermNode **nodeList)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  uint uVar3;
  char *__s;
  TSymbol *pTVar4;
  TType *pTVar5;
  TBasicType t;
  TBasicType t_00;
  TBasicType t_01;
  TBasicType t_02;
  TBasicType t_03;
  TBasicType t_04;
  TLayoutGeometry local_8c;
  byte local_86;
  byte local_85;
  TLayoutGeometry geometry;
  bool isSnorm;
  bool isUnorm;
  undefined1 local_78 [8];
  TString name;
  char *identifierString;
  TBasicType min16uint_bt;
  TBasicType min12int_bt;
  TBasicType min16int_bt;
  TBasicType half_bt;
  TBasicType min10float_bt;
  TBasicType min16float_bt;
  bool enable16BitTypes;
  TIntermNode **nodeList_local;
  TType *type_local;
  HlslGrammar *this_local;
  
  bVar1 = TParseVersions::hlslEnable16BitTypes((TParseVersions *)this->parseContext);
  t = EbtFloat;
  if (bVar1) {
    t = EbtFloat16;
  }
  t_00 = EbtFloat;
  if (bVar1) {
    t_00 = EbtFloat16;
  }
  t_01 = EbtFloat;
  if (bVar1) {
    t_01 = EbtFloat16;
  }
  t_02 = EbtInt;
  if (bVar1) {
    t_02 = EbtInt16;
  }
  t_03 = EbtInt;
  if (bVar1) {
    t_03 = EbtInt16;
  }
  t_04 = EbtUint;
  if (bVar1) {
    t_04 = EbtUint16;
  }
  if ((this->typeIdentifiers & 1U) != 0) {
    EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
    __s = getTypeString(this,EVar2);
    name.field_2._8_8_ = __s;
    if (__s != (char *)0x0) {
      pool_allocator<char>::pool_allocator((pool_allocator<char> *)&stack0xffffffffffffff80);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_78
                 ,__s,(pool_allocator<char> *)&stack0xffffffffffffff80);
      pTVar4 = TSymbolTable::find((this->parseContext->super_TParseContextBase).symbolTable,
                                  (TString *)local_78,(bool *)0x0,(bool *)0x0,(int *)0x0);
      if (pTVar4 != (TSymbol *)0x0) {
        this_local._7_1_ = 0;
      }
      geometry = (TLayoutGeometry)(pTVar4 != (TSymbol *)0x0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_78);
      if (geometry != ElgNone) goto LAB_00676dbb;
    }
  }
  local_85 = 0;
  local_86 = 0;
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  if (EVar2 == EHTokSNorm) {
    local_86 = 1;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  else if (EVar2 == EHTokUnorm) {
    local_85 = 1;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  switch(EVar2) {
  case EHTokPointStream:
  case EHTokLineStream:
  case EHTokTriangleStream:
    bVar1 = acceptStreamOutTemplateType(this,type,&local_8c);
    if (bVar1) {
      bVar1 = HlslParseContext::handleOutputGeometry
                        (this->parseContext,&(this->super_HlslTokenStream).token.loc,&local_8c);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
    goto LAB_00676dbb;
  case EHTokInputPatch:
  case EHTokOutputPatch:
    bVar1 = acceptTessellationPatchTemplateType(this,type);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
    goto LAB_00676dbb;
  case EHTokBuffer:
  case EHTokTexture1d:
  case EHTokTexture1darray:
  case EHTokTexture2d:
  case EHTokTexture2darray:
  case EHTokTexture3d:
  case EHTokTextureCube:
  case EHTokTextureCubearray:
  case EHTokTexture2DMS:
  case EHTokTexture2DMSarray:
  case EHTokRWTexture1d:
  case EHTokRWTexture1darray:
  case EHTokRWTexture2d:
  case EHTokRWTexture2darray:
  case EHTokRWTexture3d:
  case EHTokRWBuffer:
    this_local._7_1_ = acceptTextureType(this,type);
    goto LAB_00676dbb;
  case EHTokVector:
    this_local._7_1_ = acceptVectorTemplateType(this,type);
    goto LAB_00676dbb;
  case EHTokMatrix:
    this_local._7_1_ = acceptMatrixTemplateType(this,type);
    goto LAB_00676dbb;
  case EHTokVoid:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtVoid,EvqTemporary,1,0,0,false);
    break;
  case EHTokString:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtString,EvqTemporary,1,0,0,false);
    break;
  case EHTokBool:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,1,0,0,false);
    break;
  case EHTokInt:
  case EHTokDword:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,1,0,0,false);
    break;
  case EHTokUint:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,1,0,0,false);
    break;
  case EHTokUint64:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint64,EvqTemporary,1,0,0,false);
    break;
  case EHTokHalf:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,1,0,0,false);
    break;
  case EHTokFloat:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,1,0,0,false);
    break;
  case EHTokDouble:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,1,0,0,false);
    break;
  case EHTokMin16float:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,1,0,0,false);
    break;
  case EHTokMin10float:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,1,0,0,false);
    break;
  case EHTokMin16int:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,1,0,0,false);
    break;
  case EHTokMin12int:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,1,0,0,false);
    break;
  case EHTokMin16uint:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,1,0,0,false);
    break;
  case EHTokBool1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokBool2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,2,0,0,false);
    break;
  case EHTokBool3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,3,0,0,false);
    break;
  case EHTokBool4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,4,0,0,false);
    break;
  case EHTokFloat1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokFloat2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,2,0,0,false);
    break;
  case EHTokFloat3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,3,0,0,false);
    break;
  case EHTokFloat4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,4,0,0,false);
    break;
  case EHTokInt1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokInt2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,2,0,0,false);
    break;
  case EHTokInt3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,3,0,0,false);
    break;
  case EHTokInt4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,4,0,0,false);
    break;
  case EHTokDouble1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokDouble2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,2,0,0,false);
    break;
  case EHTokDouble3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,3,0,0,false);
    break;
  case EHTokDouble4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,4,0,0,false);
    break;
  case EHTokUint1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokUint2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,2,0,0,false);
    break;
  case EHTokUint3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,3,0,0,false);
    break;
  case EHTokUint4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,4,0,0,false);
    break;
  case EHTokHalf1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokHalf2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,2,0,0,false);
    break;
  case EHTokHalf3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,3,0,0,false);
    break;
  case EHTokHalf4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,4,0,0,false);
    break;
  case EHTokMin16float1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokMin16float2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,2,0,0,false);
    break;
  case EHTokMin16float3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,3,0,0,false);
    break;
  case EHTokMin16float4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,4,0,0,false);
    break;
  case EHTokMin10float1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokMin10float2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,2,0,0,false);
    break;
  case EHTokMin10float3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,3,0,0,false);
    break;
  case EHTokMin10float4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,4,0,0,false);
    break;
  case EHTokMin16int1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokMin16int2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,2,0,0,false);
    break;
  case EHTokMin16int3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,3,0,0,false);
    break;
  case EHTokMin16int4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,4,0,0,false);
    break;
  case EHTokMin12int1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokMin12int2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,2,0,0,false);
    break;
  case EHTokMin12int3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,3,0,0,false);
    break;
  case EHTokMin12int4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,4,0,0,false);
    break;
  case EHTokMin16uint1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,1,0,0,false);
    TType::makeVector(type);
    break;
  case EHTokMin16uint2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,2,0,0,false);
    break;
  case EHTokMin16uint3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,3,0,0,false);
    break;
  case EHTokMin16uint4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,4,0,0,false);
    break;
  case EHTokInt1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,1,1,false);
    break;
  case EHTokInt1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,1,2,false);
    break;
  case EHTokInt1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,1,3,false);
    break;
  case EHTokInt1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,1,4,false);
    break;
  case EHTokInt2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,2,1,false);
    break;
  case EHTokInt2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,2,2,false);
    break;
  case EHTokInt2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,2,3,false);
    break;
  case EHTokInt2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,2,4,false);
    break;
  case EHTokInt3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,3,1,false);
    break;
  case EHTokInt3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,3,2,false);
    break;
  case EHTokInt3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,3,3,false);
    break;
  case EHTokInt3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,3,4,false);
    break;
  case EHTokInt4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,4,1,false);
    break;
  case EHTokInt4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,4,2,false);
    break;
  case EHTokInt4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,4,3,false);
    break;
  case EHTokInt4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtInt,EvqTemporary,0,4,4,false);
    break;
  case EHTokUint1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,1,1,false);
    break;
  case EHTokUint1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,1,2,false);
    break;
  case EHTokUint1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,1,3,false);
    break;
  case EHTokUint1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,1,4,false);
    break;
  case EHTokUint2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,2,1,false);
    break;
  case EHTokUint2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,2,2,false);
    break;
  case EHTokUint2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,2,3,false);
    break;
  case EHTokUint2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,2,4,false);
    break;
  case EHTokUint3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,3,1,false);
    break;
  case EHTokUint3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,3,2,false);
    break;
  case EHTokUint3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,3,3,false);
    break;
  case EHTokUint3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,3,4,false);
    break;
  case EHTokUint4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,4,1,false);
    break;
  case EHTokUint4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,4,2,false);
    break;
  case EHTokUint4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,4,3,false);
    break;
  case EHTokUint4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtUint,EvqTemporary,0,4,4,false);
    break;
  case EHTokBool1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,1,1,false);
    break;
  case EHTokBool1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,1,2,false);
    break;
  case EHTokBool1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,1,3,false);
    break;
  case EHTokBool1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,1,4,false);
    break;
  case EHTokBool2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,2,1,false);
    break;
  case EHTokBool2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,2,2,false);
    break;
  case EHTokBool2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,2,3,false);
    break;
  case EHTokBool2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,2,4,false);
    break;
  case EHTokBool3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,3,1,false);
    break;
  case EHTokBool3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,3,2,false);
    break;
  case EHTokBool3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,3,3,false);
    break;
  case EHTokBool3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,3,4,false);
    break;
  case EHTokBool4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,4,1,false);
    break;
  case EHTokBool4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,4,2,false);
    break;
  case EHTokBool4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,4,3,false);
    break;
  case EHTokBool4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtBool,EvqTemporary,0,4,4,false);
    break;
  case EHTokFloat1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,1,1,false);
    break;
  case EHTokFloat1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,1,2,false);
    break;
  case EHTokFloat1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,1,3,false);
    break;
  case EHTokFloat1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,1,4,false);
    break;
  case EHTokFloat2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,2,1,false);
    break;
  case EHTokFloat2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,2,2,false);
    break;
  case EHTokFloat2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,2,3,false);
    break;
  case EHTokFloat2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,2,4,false);
    break;
  case EHTokFloat3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,3,1,false);
    break;
  case EHTokFloat3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,3,2,false);
    break;
  case EHTokFloat3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,3,3,false);
    break;
  case EHTokFloat3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,3,4,false);
    break;
  case EHTokFloat4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,4,1,false);
    break;
  case EHTokFloat4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,4,2,false);
    break;
  case EHTokFloat4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,4,3,false);
    break;
  case EHTokFloat4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtFloat,EvqTemporary,0,4,4,false);
    break;
  case EHTokHalf1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,1,1,false);
    break;
  case EHTokHalf1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,1,2,false);
    break;
  case EHTokHalf1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,1,3,false);
    break;
  case EHTokHalf1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,1,4,false);
    break;
  case EHTokHalf2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,2,1,false);
    break;
  case EHTokHalf2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,2,2,false);
    break;
  case EHTokHalf2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,2,3,false);
    break;
  case EHTokHalf2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,2,4,false);
    break;
  case EHTokHalf3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,3,1,false);
    break;
  case EHTokHalf3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,3,2,false);
    break;
  case EHTokHalf3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,3,3,false);
    break;
  case EHTokHalf3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,3,4,false);
    break;
  case EHTokHalf4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,4,1,false);
    break;
  case EHTokHalf4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,4,2,false);
    break;
  case EHTokHalf4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,4,3,false);
    break;
  case EHTokHalf4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_01,EvqTemporary,0,4,4,false);
    break;
  case EHTokDouble1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,1,1,false);
    break;
  case EHTokDouble1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,1,2,false);
    break;
  case EHTokDouble1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,1,3,false);
    break;
  case EHTokDouble1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,1,4,false);
    break;
  case EHTokDouble2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,2,1,false);
    break;
  case EHTokDouble2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,2,2,false);
    break;
  case EHTokDouble2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,2,3,false);
    break;
  case EHTokDouble2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,2,4,false);
    break;
  case EHTokDouble3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,3,1,false);
    break;
  case EHTokDouble3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,3,2,false);
    break;
  case EHTokDouble3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,3,3,false);
    break;
  case EHTokDouble3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,3,4,false);
    break;
  case EHTokDouble4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,4,1,false);
    break;
  case EHTokDouble4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,4,2,false);
    break;
  case EHTokDouble4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,4,3,false);
    break;
  case EHTokDouble4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,EbtDouble,EvqTemporary,0,4,4,false);
    break;
  case EHTokMin16float1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,1,1,false);
    break;
  case EHTokMin16float1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,1,2,false);
    break;
  case EHTokMin16float1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,1,3,false);
    break;
  case EHTokMin16float1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,1,4,false);
    break;
  case EHTokMin16float2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,2,1,false);
    break;
  case EHTokMin16float2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,2,2,false);
    break;
  case EHTokMin16float2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,2,3,false);
    break;
  case EHTokMin16float2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,2,4,false);
    break;
  case EHTokMin16float3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,3,1,false);
    break;
  case EHTokMin16float3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,3,2,false);
    break;
  case EHTokMin16float3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,3,3,false);
    break;
  case EHTokMin16float3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,3,4,false);
    break;
  case EHTokMin16float4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,4,1,false);
    break;
  case EHTokMin16float4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,4,2,false);
    break;
  case EHTokMin16float4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,4,3,false);
    break;
  case EHTokMin16float4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t,EvqTemporary,EpqMedium,0,4,4,false);
    break;
  case EHTokMin10float1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,1,1,false);
    break;
  case EHTokMin10float1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,1,2,false);
    break;
  case EHTokMin10float1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,1,3,false);
    break;
  case EHTokMin10float1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,1,4,false);
    break;
  case EHTokMin10float2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,2,1,false);
    break;
  case EHTokMin10float2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,2,2,false);
    break;
  case EHTokMin10float2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,2,3,false);
    break;
  case EHTokMin10float2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,2,4,false);
    break;
  case EHTokMin10float3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,3,1,false);
    break;
  case EHTokMin10float3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,3,2,false);
    break;
  case EHTokMin10float3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,3,3,false);
    break;
  case EHTokMin10float3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,3,4,false);
    break;
  case EHTokMin10float4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,4,1,false);
    break;
  case EHTokMin10float4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,4,2,false);
    break;
  case EHTokMin10float4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,4,3,false);
    break;
  case EHTokMin10float4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_00,EvqTemporary,EpqMedium,0,4,4,false);
    break;
  case EHTokMin16int1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,1,1,false);
    break;
  case EHTokMin16int1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,1,2,false);
    break;
  case EHTokMin16int1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,1,3,false);
    break;
  case EHTokMin16int1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,1,4,false);
    break;
  case EHTokMin16int2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,2,1,false);
    break;
  case EHTokMin16int2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,2,2,false);
    break;
  case EHTokMin16int2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,2,3,false);
    break;
  case EHTokMin16int2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,2,4,false);
    break;
  case EHTokMin16int3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,3,1,false);
    break;
  case EHTokMin16int3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,3,2,false);
    break;
  case EHTokMin16int3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,3,3,false);
    break;
  case EHTokMin16int3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,3,4,false);
    break;
  case EHTokMin16int4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,4,1,false);
    break;
  case EHTokMin16int4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,4,2,false);
    break;
  case EHTokMin16int4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,4,3,false);
    break;
  case EHTokMin16int4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_02,EvqTemporary,EpqMedium,0,4,4,false);
    break;
  case EHTokMin12int1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,1,1,false);
    break;
  case EHTokMin12int1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,1,2,false);
    break;
  case EHTokMin12int1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,1,3,false);
    break;
  case EHTokMin12int1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,1,4,false);
    break;
  case EHTokMin12int2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,2,1,false);
    break;
  case EHTokMin12int2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,2,2,false);
    break;
  case EHTokMin12int2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,2,3,false);
    break;
  case EHTokMin12int2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,2,4,false);
    break;
  case EHTokMin12int3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,3,1,false);
    break;
  case EHTokMin12int3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,3,2,false);
    break;
  case EHTokMin12int3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,3,3,false);
    break;
  case EHTokMin12int3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,3,4,false);
    break;
  case EHTokMin12int4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,4,1,false);
    break;
  case EHTokMin12int4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,4,2,false);
    break;
  case EHTokMin12int4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,4,3,false);
    break;
  case EHTokMin12int4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_03,EvqTemporary,EpqMedium,0,4,4,false);
    break;
  case EHTokMin16uint1x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,1,1,false);
    break;
  case EHTokMin16uint1x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,1,2,false);
    break;
  case EHTokMin16uint1x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,1,3,false);
    break;
  case EHTokMin16uint1x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,1,4,false);
    break;
  case EHTokMin16uint2x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,2,1,false);
    break;
  case EHTokMin16uint2x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,2,2,false);
    break;
  case EHTokMin16uint2x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,2,3,false);
    break;
  case EHTokMin16uint2x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,2,4,false);
    break;
  case EHTokMin16uint3x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,3,1,false);
    break;
  case EHTokMin16uint3x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,3,2,false);
    break;
  case EHTokMin16uint3x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,3,3,false);
    break;
  case EHTokMin16uint3x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,3,4,false);
    break;
  case EHTokMin16uint4x1:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,4,1,false);
    break;
  case EHTokMin16uint4x2:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,4,2,false);
    break;
  case EHTokMin16uint4x3:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,4,3,false);
    break;
  case EHTokMin16uint4x4:
    pTVar5 = (TType *)TType::operator_new(0x98,type);
    TType::TType(pTVar5,t_04,EvqTemporary,EpqMedium,0,4,4,false);
    break;
  case EHTokSampler:
  case EHTokSampler1d:
  case EHTokSampler2d:
  case EHTokSampler3d:
  case EHTokSamplerCube:
    bVar1 = TParseVersions::hlslDX9Compatible((TParseVersions *)this->parseContext);
    if (bVar1) {
      this_local._7_1_ = acceptSamplerTypeDX9(this,type);
    }
    else {
      this_local._7_1_ = acceptSamplerType(this,type);
    }
    goto LAB_00676dbb;
  case EHTokSamplerState:
  case EHTokSamplerComparisonState:
    this_local._7_1_ = acceptSamplerType(this,type);
    goto LAB_00676dbb;
  default:
    this_local._7_1_ = 0;
    goto LAB_00676dbb;
  case EHTokSubpassInput:
  case EHTokSubpassInputMS:
    this_local._7_1_ = acceptSubpassInputType(this,type);
    goto LAB_00676dbb;
  case EHTokAppendStructuredBuffer:
  case EHTokByteAddressBuffer:
  case EHTokConsumeStructuredBuffer:
  case EHTokRWByteAddressBuffer:
  case EHTokRWStructuredBuffer:
  case EHTokStructuredBuffer:
    this_local._7_1_ = acceptStructBufferType(this,type);
    goto LAB_00676dbb;
  case EHTokTextureBuffer:
    this_local._7_1_ = acceptTextureBufferType(this,type);
    goto LAB_00676dbb;
  case EHTokIdentifier:
    pTVar4 = HlslParseContext::lookupUserType
                       (this->parseContext,(this->super_HlslTokenStream).token.field_2.string,type);
    if (pTVar4 == (TSymbol *)0x0) {
      this_local._7_1_ = 0;
    }
    else {
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
      this_local._7_1_ = 1;
    }
    goto LAB_00676dbb;
  case EHTokClass:
  case EHTokStruct:
  case EHTokCBuffer:
  case EHTokTBuffer:
    this_local._7_1_ = acceptStruct(this,type,nodeList);
    goto LAB_00676dbb;
  case EHTokConstantBuffer:
    this_local._7_1_ = acceptConstantBufferType(this,type);
    goto LAB_00676dbb;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  if ((((local_85 & 1) == 0) && ((local_86 & 1) == 0)) ||
     (uVar3 = (*type->_vptr_TType[0x26])(), (uVar3 & 1) != 0)) {
    this_local._7_1_ = 1;
  }
  else {
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this->parseContext,&(this->super_HlslTokenStream).token,
               "unorm and snorm only valid in floating point domain","");
    this_local._7_1_ = 0;
  }
LAB_00676dbb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HlslGrammar::acceptType(TType& type, TIntermNode*& nodeList)
{
    // Basic types for min* types, use native halfs if the option allows them.
    bool enable16BitTypes = parseContext.hlslEnable16BitTypes();

    const TBasicType min16float_bt = enable16BitTypes ? EbtFloat16 : EbtFloat;
    const TBasicType min10float_bt = enable16BitTypes ? EbtFloat16 : EbtFloat;
    const TBasicType half_bt       = enable16BitTypes ? EbtFloat16 : EbtFloat;
    const TBasicType min16int_bt   = enable16BitTypes ? EbtInt16   : EbtInt;
    const TBasicType min12int_bt   = enable16BitTypes ? EbtInt16   : EbtInt;
    const TBasicType min16uint_bt  = enable16BitTypes ? EbtUint16  : EbtUint;

    // Some types might have turned into identifiers. Take the hit for checking
    // when this has happened.
    if (typeIdentifiers) {
        const char* identifierString = getTypeString(peek());
        if (identifierString != nullptr) {
            TString name = identifierString;
            // if it's an identifier, it's not a type
            if (parseContext.symbolTable.find(name) != nullptr)
                return false;
        }
    }

    bool isUnorm = false;
    bool isSnorm = false;

    // Accept snorm and unorm.  Presently, this is ignored, save for an error check below.
    switch (peek()) {
    case EHTokUnorm:
        isUnorm = true;
        advanceToken();  // eat the token
        break;
    case EHTokSNorm:
        isSnorm = true;
        advanceToken();  // eat the token
        break;
    default:
        break;
    }

    switch (peek()) {
    case EHTokVector:
        return acceptVectorTemplateType(type);
        break;

    case EHTokMatrix:
        return acceptMatrixTemplateType(type);
        break;

    case EHTokPointStream:            // fall through
    case EHTokLineStream:             // ...
    case EHTokTriangleStream:         // ...
        {
            TLayoutGeometry geometry;
            if (! acceptStreamOutTemplateType(type, geometry))
                return false;

            if (! parseContext.handleOutputGeometry(token.loc, geometry))
                return false;

            return true;
        }

    case EHTokInputPatch:             // fall through
    case EHTokOutputPatch:            // ...
        {
            if (! acceptTessellationPatchTemplateType(type))
                return false;

            return true;
        }

    case EHTokSampler:                // fall through
    case EHTokSampler1d:              // ...
    case EHTokSampler2d:              // ...
    case EHTokSampler3d:              // ...
    case EHTokSamplerCube:            // ...
        if (parseContext.hlslDX9Compatible())
            return acceptSamplerTypeDX9(type);
        else
            return acceptSamplerType(type);
        break;

    case EHTokSamplerState:           // fall through
    case EHTokSamplerComparisonState: // ...
        return acceptSamplerType(type);
        break;

    case EHTokSubpassInput:           // fall through
    case EHTokSubpassInputMS:         // ...
        return acceptSubpassInputType(type);
        break;

    case EHTokBuffer:                 // fall through
    case EHTokTexture1d:              // ...
    case EHTokTexture1darray:         // ...
    case EHTokTexture2d:              // ...
    case EHTokTexture2darray:         // ...
    case EHTokTexture3d:              // ...
    case EHTokTextureCube:            // ...
    case EHTokTextureCubearray:       // ...
    case EHTokTexture2DMS:            // ...
    case EHTokTexture2DMSarray:       // ...
    case EHTokRWTexture1d:            // ...
    case EHTokRWTexture1darray:       // ...
    case EHTokRWTexture2d:            // ...
    case EHTokRWTexture2darray:       // ...
    case EHTokRWTexture3d:            // ...
    case EHTokRWBuffer:               // ...
        return acceptTextureType(type);
        break;

    case EHTokAppendStructuredBuffer:
    case EHTokByteAddressBuffer:
    case EHTokConsumeStructuredBuffer:
    case EHTokRWByteAddressBuffer:
    case EHTokRWStructuredBuffer:
    case EHTokStructuredBuffer:
        return acceptStructBufferType(type);
        break;

    case EHTokTextureBuffer:
        return acceptTextureBufferType(type);
        break;

    case EHTokConstantBuffer:
        return acceptConstantBufferType(type);

    case EHTokClass:
    case EHTokStruct:
    case EHTokCBuffer:
    case EHTokTBuffer:
        return acceptStruct(type, nodeList);

    case EHTokIdentifier:
        // An identifier could be for a user-defined type.
        // Note we cache the symbol table lookup, to save for a later rule
        // when this is not a type.
        if (parseContext.lookupUserType(*token.string, type) != nullptr) {
            advanceToken();
            return true;
        } else
            return false;

    case EHTokVoid:
        new(&type) TType(EbtVoid);
        break;

    case EHTokString:
        new(&type) TType(EbtString);
        break;

    case EHTokFloat:
        new(&type) TType(EbtFloat);
        break;
    case EHTokFloat1:
        new(&type) TType(EbtFloat);
        type.makeVector();
        break;
    case EHTokFloat2:
        new(&type) TType(EbtFloat, EvqTemporary, 2);
        break;
    case EHTokFloat3:
        new(&type) TType(EbtFloat, EvqTemporary, 3);
        break;
    case EHTokFloat4:
        new(&type) TType(EbtFloat, EvqTemporary, 4);
        break;

    case EHTokDouble:
        new(&type) TType(EbtDouble);
        break;
    case EHTokDouble1:
        new(&type) TType(EbtDouble);
        type.makeVector();
        break;
    case EHTokDouble2:
        new(&type) TType(EbtDouble, EvqTemporary, 2);
        break;
    case EHTokDouble3:
        new(&type) TType(EbtDouble, EvqTemporary, 3);
        break;
    case EHTokDouble4:
        new(&type) TType(EbtDouble, EvqTemporary, 4);
        break;

    case EHTokInt:
    case EHTokDword:
        new(&type) TType(EbtInt);
        break;
    case EHTokInt1:
        new(&type) TType(EbtInt);
        type.makeVector();
        break;
    case EHTokInt2:
        new(&type) TType(EbtInt, EvqTemporary, 2);
        break;
    case EHTokInt3:
        new(&type) TType(EbtInt, EvqTemporary, 3);
        break;
    case EHTokInt4:
        new(&type) TType(EbtInt, EvqTemporary, 4);
        break;

    case EHTokUint:
        new(&type) TType(EbtUint);
        break;
    case EHTokUint1:
        new(&type) TType(EbtUint);
        type.makeVector();
        break;
    case EHTokUint2:
        new(&type) TType(EbtUint, EvqTemporary, 2);
        break;
    case EHTokUint3:
        new(&type) TType(EbtUint, EvqTemporary, 3);
        break;
    case EHTokUint4:
        new(&type) TType(EbtUint, EvqTemporary, 4);
        break;

    case EHTokUint64:
        new(&type) TType(EbtUint64);
        break;

    case EHTokBool:
        new(&type) TType(EbtBool);
        break;
    case EHTokBool1:
        new(&type) TType(EbtBool);
        type.makeVector();
        break;
    case EHTokBool2:
        new(&type) TType(EbtBool, EvqTemporary, 2);
        break;
    case EHTokBool3:
        new(&type) TType(EbtBool, EvqTemporary, 3);
        break;
    case EHTokBool4:
        new(&type) TType(EbtBool, EvqTemporary, 4);
        break;

    case EHTokHalf:
        new(&type) TType(half_bt, EvqTemporary);
        break;
    case EHTokHalf1:
        new(&type) TType(half_bt, EvqTemporary);
        type.makeVector();
        break;
    case EHTokHalf2:
        new(&type) TType(half_bt, EvqTemporary, 2);
        break;
    case EHTokHalf3:
        new(&type) TType(half_bt, EvqTemporary, 3);
        break;
    case EHTokHalf4:
        new(&type) TType(half_bt, EvqTemporary, 4);
        break;

    case EHTokMin16float:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin16float1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin16float2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin16float3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin16float4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin10float:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin10float1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin10float2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin10float3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin10float4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin16int:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin16int1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin16int2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin16int3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin16int4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin12int:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin12int1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin12int2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin12int3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin12int4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin16uint:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin16uint1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin16uint2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin16uint3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin16uint4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokInt1x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 1);
        break;
    case EHTokInt1x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 2);
        break;
    case EHTokInt1x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 3);
        break;
    case EHTokInt1x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 4);
        break;
    case EHTokInt2x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 1);
        break;
    case EHTokInt2x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 2);
        break;
    case EHTokInt2x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 3);
        break;
    case EHTokInt2x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 4);
        break;
    case EHTokInt3x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 1);
        break;
    case EHTokInt3x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 2);
        break;
    case EHTokInt3x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 3);
        break;
    case EHTokInt3x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 4);
        break;
    case EHTokInt4x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 1);
        break;
    case EHTokInt4x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 2);
        break;
    case EHTokInt4x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 3);
        break;
    case EHTokInt4x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 4);
        break;

    case EHTokUint1x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 1);
        break;
    case EHTokUint1x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 2);
        break;
    case EHTokUint1x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 3);
        break;
    case EHTokUint1x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 4);
        break;
    case EHTokUint2x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 1);
        break;
    case EHTokUint2x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 2);
        break;
    case EHTokUint2x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 3);
        break;
    case EHTokUint2x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 4);
        break;
    case EHTokUint3x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 1);
        break;
    case EHTokUint3x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 2);
        break;
    case EHTokUint3x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 3);
        break;
    case EHTokUint3x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 4);
        break;
    case EHTokUint4x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 1);
        break;
    case EHTokUint4x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 2);
        break;
    case EHTokUint4x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 3);
        break;
    case EHTokUint4x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 4);
        break;

    case EHTokBool1x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 1);
        break;
    case EHTokBool1x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 2);
        break;
    case EHTokBool1x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 3);
        break;
    case EHTokBool1x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 4);
        break;
    case EHTokBool2x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 1);
        break;
    case EHTokBool2x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 2);
        break;
    case EHTokBool2x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 3);
        break;
    case EHTokBool2x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 4);
        break;
    case EHTokBool3x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 1);
        break;
    case EHTokBool3x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 2);
        break;
    case EHTokBool3x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 3);
        break;
    case EHTokBool3x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 4);
        break;
    case EHTokBool4x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 1);
        break;
    case EHTokBool4x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 2);
        break;
    case EHTokBool4x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 3);
        break;
    case EHTokBool4x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 4);
        break;

    case EHTokFloat1x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 1);
        break;
    case EHTokFloat1x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 2);
        break;
    case EHTokFloat1x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 3);
        break;
    case EHTokFloat1x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 4);
        break;
    case EHTokFloat2x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 1);
        break;
    case EHTokFloat2x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 2);
        break;
    case EHTokFloat2x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 3);
        break;
    case EHTokFloat2x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 4);
        break;
    case EHTokFloat3x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 1);
        break;
    case EHTokFloat3x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 2);
        break;
    case EHTokFloat3x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 3);
        break;
    case EHTokFloat3x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 4);
        break;
    case EHTokFloat4x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 1);
        break;
    case EHTokFloat4x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 2);
        break;
    case EHTokFloat4x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 3);
        break;
    case EHTokFloat4x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 4);
        break;

    case EHTokHalf1x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 1);
        break;
    case EHTokHalf1x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 2);
        break;
    case EHTokHalf1x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 3);
        break;
    case EHTokHalf1x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 4);
        break;
    case EHTokHalf2x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 1);
        break;
    case EHTokHalf2x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 2);
        break;
    case EHTokHalf2x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 3);
        break;
    case EHTokHalf2x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 4);
        break;
    case EHTokHalf3x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 1);
        break;
    case EHTokHalf3x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 2);
        break;
    case EHTokHalf3x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 3);
        break;
    case EHTokHalf3x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 4);
        break;
    case EHTokHalf4x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 1);
        break;
    case EHTokHalf4x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 2);
        break;
    case EHTokHalf4x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 3);
        break;
    case EHTokHalf4x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 4);
        break;

    case EHTokDouble1x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 1);
        break;
    case EHTokDouble1x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 2);
        break;
    case EHTokDouble1x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 3);
        break;
    case EHTokDouble1x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 4);
        break;
    case EHTokDouble2x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 1);
        break;
    case EHTokDouble2x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 2);
        break;
    case EHTokDouble2x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 3);
        break;
    case EHTokDouble2x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 4);
        break;
    case EHTokDouble3x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 1);
        break;
    case EHTokDouble3x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 2);
        break;
    case EHTokDouble3x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 3);
        break;
    case EHTokDouble3x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 4);
        break;
    case EHTokDouble4x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 1);
        break;
    case EHTokDouble4x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 2);
        break;
    case EHTokDouble4x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 3);
        break;
    case EHTokDouble4x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 4);
        break;

    case EHTokMin16float1x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin16float1x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin16float1x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin16float1x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin16float2x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin16float2x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin16float2x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin16float2x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin16float3x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin16float3x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin16float3x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin16float3x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin16float4x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin16float4x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin16float4x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin16float4x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin10float1x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin10float1x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin10float1x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin10float1x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin10float2x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin10float2x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin10float2x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin10float2x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin10float3x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin10float3x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin10float3x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin10float3x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin10float4x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin10float4x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin10float4x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin10float4x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin16int1x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin16int1x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin16int1x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin16int1x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin16int2x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin16int2x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin16int2x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin16int2x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin16int3x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin16int3x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin16int3x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin16int3x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin16int4x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin16int4x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin16int4x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin16int4x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin12int1x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin12int1x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin12int1x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin12int1x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin12int2x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin12int2x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin12int2x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin12int2x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin12int3x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin12int3x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin12int3x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin12int3x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin12int4x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin12int4x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin12int4x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin12int4x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin16uint1x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin16uint1x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin16uint1x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin16uint1x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin16uint2x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin16uint2x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin16uint2x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin16uint2x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin16uint3x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin16uint3x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin16uint3x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin16uint3x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin16uint4x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin16uint4x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin16uint4x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin16uint4x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    default:
        return false;
    }

    advanceToken();

    if ((isUnorm || isSnorm) && !type.isFloatingDomain()) {
        parseContext.error(token.loc, "unorm and snorm only valid in floating point domain", "", "");
        return false;
    }

    return true;
}